

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_empty_final_object(void)

{
  uint uVar1;
  int iVar2;
  int __fd;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  bson_error_t error;
  _Bool r;
  bson_t b;
  bson_t *bson;
  char *json;
  uint local_3d0;
  uint local_3b4;
  uint local_3b0;
  undefined1 local_388 [8];
  undefined1 auStack_380 [511];
  byte local_181;
  undefined4 local_180;
  uint local_17c;
  undefined1 local_178;
  long local_a0;
  char *local_98;
  
  local_98 = "{\"a\": {\"b\": {}}}";
  local_a0 = bcon_new(0,"a","{","b","{","}","}",0);
  memset(&local_180,0,0x80);
  local_180 = 3;
  local_17c = 5;
  local_178 = 5;
  local_181 = bson_init_from_json(&local_180,local_98,0xffffffffffffffff,local_388);
  local_181 = local_181 & 1;
  if (local_181 == 0) {
    fprintf(_stderr,"%s\n",auStack_380);
  }
  if ((local_181 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8f2,"test_bson_json_empty_final_object","r");
    abort();
  }
  __buf = (void *)bson_get_data(&local_180);
  __buf_00 = (void *)bson_get_data(local_a0);
  local_3b4 = 0xffffffff;
  bVar7 = true;
  if (*(uint *)(local_a0 + 4) == local_17c) {
    __s1 = (void *)bson_get_data(local_a0);
    __s2 = (void *)bson_get_data(&local_180);
    iVar2 = memcmp(__s1,__s2,(ulong)*(uint *)(local_a0 + 4));
    bVar7 = iVar2 != 0;
  }
  if (!bVar7) {
    bson_destroy(&local_180);
    bson_destroy(local_a0);
    return;
  }
  uVar3 = bson_as_canonical_extended_json(&local_180,0);
  uVar4 = bson_as_canonical_extended_json(local_a0,0);
  local_3b0 = 0;
  while( true ) {
    bVar7 = false;
    if (local_3b0 < local_17c) {
      bVar7 = local_3b0 < *(uint *)(local_a0 + 4);
    }
    if (!bVar7) goto LAB_0013404b;
    if (*(char *)((long)__buf + (ulong)local_3b0) != *(char *)((long)__buf_00 + (ulong)local_3b0))
    break;
    local_3b0 = local_3b0 + 1;
  }
  local_3b4 = local_3b0;
LAB_0013404b:
  if (local_3b4 == 0xffffffff) {
    if (local_17c < *(uint *)(local_a0 + 4)) {
      local_3d0 = *(uint *)(local_a0 + 4);
    }
    else {
      local_3d0 = local_17c;
    }
    local_3b4 = local_3d0 - 1;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_3b4,uVar3,uVar4);
  iVar2 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar2 == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8f3,"test_bson_json_empty_final_object","fd1 != -1");
    abort();
  }
  if (__fd == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8f3,"test_bson_json_empty_final_object","fd2 != -1");
    abort();
  }
  uVar6 = (ulong)local_17c;
  uVar5 = write(iVar2,__buf,(ulong)local_17c);
  if (uVar6 == uVar5) {
    uVar1 = *(uint *)(local_a0 + 4);
    uVar6 = write(__fd,__buf_00,(ulong)*(uint *)(local_a0 + 4));
    if (uVar1 == uVar6) {
      close(iVar2);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x8f3,"test_bson_json_empty_final_object","0");
      abort();
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8f3,"test_bson_json_empty_final_object",
            "(bson)->len == bson_write (fd2, expected_data, (bson)->len)");
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x8f3,"test_bson_json_empty_final_object",
          "(&b)->len == bson_write (fd1, bson_data, (&b)->len)");
  abort();
}

Assistant:

static void
test_bson_json_empty_final_object (void)
{
   const char *json = "{\"a\": {\"b\": {}}}";
   bson_t *bson = BCON_NEW ("a", "{", "b", "{", "}", "}");
   bson_t b = BSON_INITIALIZER;
   bool r;
   bson_error_t error;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r) {
      fprintf (stderr, "%s\n", error.message);
   }

   BSON_ASSERT (r);
   bson_eq_bson (&b, bson);

   bson_destroy (&b);
   bson_destroy (bson);
}